

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain_vine_swap.h
# Opt level: O3

void __thiscall
Gudhi::persistence_matrix::
Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_true>_>_>
::positive_transpose
          (Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_true>_>_>
           *this,ID_index pivot1,ID_index pivot2)

{
  uint uVar1;
  uint simplexIndex;
  pointer puVar2;
  Pos_index *pPVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  puVar2 = (this->pivotToPosition_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar1 = puVar2[pivot1];
  uVar5 = (ulong)uVar1;
  simplexIndex = puVar2[pivot2];
  uVar7 = (ulong)simplexIndex;
  pPVar3 = _birth(this,uVar1);
  *pPVar3 = simplexIndex;
  pPVar3 = _birth(this,simplexIndex);
  *pPVar3 = uVar1;
  puVar2 = (this->
           super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_true>_>_>
           ).indexToBar_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = (long)(this->
                super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_true>_>_>
                ).indexToBar_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 2;
  uVar6 = uVar5;
  if ((uVar5 < uVar4) && (uVar6 = uVar7, uVar7 < uVar4)) {
    uVar1 = puVar2[uVar5];
    puVar2[uVar5] = puVar2[uVar7];
    puVar2[uVar7] = uVar1;
    return;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar6);
}

Assistant:

void positive_transpose(ID_index pivot1, ID_index pivot2) {
    Pos_index pos1 = _get_pivot_position(pivot1);
    Pos_index pos2 = _get_pivot_position(pivot2);

    _birth(pos1) = pos2;
    _birth(pos2) = pos1;
    std::swap(CP::indexToBar_.at(pos1), CP::indexToBar_.at(pos2));
  }